

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

int luaD_poscall(lua_State *L,StkId firstResult)

{
  short sVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  int iVar4;
  CallInfo *pCVar5;
  TValue *io2;
  
  pCVar2 = L->ci;
  if ((L->hookmask & 6) == 0) {
    pCVar5 = pCVar2->previous;
  }
  else {
    if ((L->hookmask & 2) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar3) + (long)L->stack);
    }
    pCVar5 = pCVar2->previous;
    L->oldpc = (pCVar5->u).l.savedpc;
  }
  pTVar3 = pCVar2->func;
  sVar1 = pCVar2->nresults;
  L->ci = pCVar5;
  iVar4 = (int)sVar1;
  for (; (iVar4 != 0 && (firstResult < L->top)); firstResult = firstResult + 1) {
    pTVar3->value_ = firstResult->value_;
    pTVar3->tt_ = firstResult->tt_;
    pTVar3 = pTVar3 + 1;
    iVar4 = iVar4 + -1;
  }
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    pTVar3->tt_ = 0;
    pTVar3 = pTVar3 + 1;
  }
  L->top = pTVar3;
  return sVar1 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci = L->ci;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->ci = ci = ci->previous;  /* back to caller */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}